

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void obmc_variance(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
                  int *sum)

{
  int local_40;
  int diff;
  int tsum;
  uint tsse;
  int j;
  int i;
  int h_local;
  int w_local;
  int32_t *mask_local;
  int32_t *wsrc_local;
  int pre_stride_local;
  uint8_t *pre_local;
  
  tsse = 0;
  tsum = 0;
  mask_local = mask;
  wsrc_local = wsrc;
  pre_local = pre;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      if ((int)(wsrc_local[j] - (uint)pre_local[j] * mask_local[j]) < 0) {
        local_40 = -((int)(0x800 - (wsrc_local[j] - (uint)pre_local[j] * mask_local[j])) >> 0xc);
      }
      else {
        local_40 = (int)((wsrc_local[j] - (uint)pre_local[j] * mask_local[j]) + 0x800) >> 0xc;
      }
      tsum = local_40 + tsum;
      tsse = local_40 * local_40 + tsse;
    }
    pre_local = pre_local + pre_stride;
    wsrc_local = wsrc_local + w;
    mask_local = mask_local + w;
  }
  *sse = tsse;
  *sum = tsum;
  return;
}

Assistant:

static inline void obmc_variance(const uint8_t *pre, int pre_stride,
                                 const int32_t *wsrc, const int32_t *mask,
                                 int w, int h, unsigned int *sse, int *sum) {
  int i, j;
  unsigned int tsse = 0;
  int tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}